

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::loadObject
               (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> **objToLoad,int initSize,
               bool toCallDestructor,XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *pMVar2;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *this;
  XMLSize_t maxElems;
  SchemaElementDecl *local_48;
  SchemaElementDecl *data;
  XMLSize_t i;
  XMLSize_t vectorSize;
  XSerializeEngine *local_20;
  XSerializeEngine *serEng_local;
  bool toCallDestructor_local;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> **ppVStack_10;
  int initSize_local;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> **objToLoad_local;
  
  local_20 = serEng;
  serEng_local._3_1_ = toCallDestructor;
  serEng_local._4_4_ = initSize;
  ppVStack_10 = objToLoad;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    if (*ppVStack_10 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
      if (serEng_local._4_4_ < 0) {
        serEng_local._4_4_ = 0x10;
      }
      pMVar2 = XSerializeEngine::getMemoryManager(local_20);
      this = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)XMemory::operator_new(0x28,pMVar2);
      maxElems = (XMLSize_t)serEng_local._4_4_;
      pMVar2 = XSerializeEngine::getMemoryManager(local_20);
      ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf
                (this,maxElems,pMVar2,(bool)(serEng_local._3_1_ & 1));
      *ppVStack_10 = this;
    }
    XSerializeEngine::registerObject(local_20,*ppVStack_10);
    i = 0;
    XSerializeEngine::readSize(local_20,&i);
    for (data = (SchemaElementDecl *)0x0; data < i;
        data = (SchemaElementDecl *)
               ((long)&(data->super_XMLElementDecl).super_XSerializable._vptr_XSerializable + 1)) {
      xercesc_4_0::operator>>(local_20,&local_48);
      ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::addElement(*ppVStack_10,&local_48);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(ValueVectorOf<SchemaElementDecl*>**       objToLoad
                                   , int                                       initSize
                                   , bool                                      toCallDestructor
                                   , XSerializeEngine&                         serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             ValueVectorOf<SchemaElementDecl*>(
                                                               initSize
                                                             , serEng.getMemoryManager()
                                                             , toCallDestructor
                                                             );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorSize = 0;
        serEng.readSize (vectorSize);

        for (XMLSize_t i = 0; i < vectorSize; i++)
        {
            SchemaElementDecl* data;
            serEng>>data;
            (*objToLoad)->addElement(data);
        }
    }
}